

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryReader::readTypes(WasmBinaryReader *this)

{
  pointer *os;
  uint uVar1;
  _Hash_node_base *p_Var2;
  byte bVar3;
  uint32_t uVar4;
  Mutability MVar5;
  int32_t iVar6;
  HeapTypeKind HVar7;
  size_t sVar8;
  _Storage<wasm::HeapType,_true> _Var9;
  Type TVar10;
  Type TVar11;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  pointer pHVar12;
  mapped_type *pmVar13;
  Struct *pSVar14;
  mapped_type *pmVar15;
  ostream *poVar16;
  long *plVar17;
  string *psVar18;
  char *pcVar19;
  size_type *psVar20;
  ulong uVar21;
  _Hash_node_base *p_Var22;
  ulong uVar23;
  _Hash_node_base *p_Var24;
  ulong uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  pair<wasm::HeapType,_wasm::Exactness> pVar28;
  optional<wasm::HeapType> super;
  optional<wasm::HeapType> desc;
  optional<wasm::HeapType> desc_00;
  Signature signature;
  Name name;
  Name name_00;
  undefined1 local_2e8 [8];
  anon_class_16_2_dbef1248 readHeapType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  undefined1 auStack_238 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  string local_b0;
  undefined1 local_90 [8];
  anon_class_24_3_475464a4 makeType;
  Field local_68;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> results;
  TypeBuilder builder;
  
  uVar4 = getU32LEB(this);
  TypeBuilder::TypeBuilder((TypeBuilder *)&stack0xffffffffffffffc8,(ulong)uVar4);
  makeType.this = (WasmBinaryReader *)local_2e8;
  uVar25 = 0;
  local_2e8 = (undefined1  [8])this;
  readHeapType.this = (WasmBinaryReader *)&stack0xffffffffffffffc8;
  local_90 = (undefined1  [8])this;
  makeType.readHeapType = (anon_class_16_2_dbef1248 *)&stack0xffffffffffffffc8;
  do {
    sVar8 = TypeBuilder::size((TypeBuilder *)&stack0xffffffffffffffc8);
    if (sVar8 <= uVar25) {
      TypeBuilder::build((BuildResult *)auStack_58,(TypeBuilder *)&stack0xffffffffffffffc8);
      if ((byte)results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == 1) {
        Fatal::Fatal((Fatal *)auStack_238);
        os = &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_finish;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"Invalid type: ",0xe);
        wasm::operator<<((ostream *)os,
                         (ErrorReason)
                         results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                         .super__Vector_impl_data._M_start);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os," at index ",10);
        Fatal::operator<<((Fatal *)auStack_238,(unsigned_long *)auStack_58);
        Fatal::~Fatal((Fatal *)auStack_238);
      }
      __x = std::
            get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                      ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        *)auStack_58);
      makeType.builder = (TypeBuilder *)&this->types;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)makeType.builder,__x);
      pHVar12 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_finish != pHVar12) {
        uVar25 = 0;
        do {
          auStack_238 = (undefined1  [8])pHVar12[uVar25].id;
          params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,(int)uVar25);
          std::
          _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                    ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->wasm->typeIndices,auStack_238);
          uVar25 = (ulong)((int)uVar25 + 1);
          pHVar12 = (this->types).
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar25 < (ulong)((long)(this->types).
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar12
                                 >> 3));
      }
      p_Var24 = (this->typeNames)._M_h._M_before_begin._M_nxt;
      if (p_Var24 != (_Hash_node_base *)0x0) {
        do {
          pHVar12 = (this->types).
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)*(uint *)&p_Var24[1]._M_nxt <
              (ulong)((long)(this->types).
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pHVar12 >> 3)) {
            pmVar13 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->wasm->typeNames,pHVar12 + *(uint *)&p_Var24[1]._M_nxt);
            p_Var22 = p_Var24[3]._M_nxt;
            (pmVar13->name).super_IString.str._M_len = (size_t)p_Var24[2]._M_nxt;
            (pmVar13->name).super_IString.str._M_str = (char *)p_Var22;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"warning: type index out of bounds in name section: ",
                       0x33);
            name.super_IString.str._M_str = (char *)pHVar12;
            name.super_IString.str._M_len = (size_t)p_Var24[3]._M_nxt;
            poVar16 = wasm::operator<<((wasm *)&std::cerr,(ostream *)p_Var24[2]._M_nxt,name);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16," at index ",10);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            auStack_238[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,auStack_238,1);
          }
          p_Var24 = p_Var24->_M_nxt;
        } while (p_Var24 != (_Hash_node_base *)0x0);
      }
      for (p_Var24 = (this->fieldNames)._M_h._M_before_begin._M_nxt;
          p_Var24 != (_Hash_node_base *)0x0; p_Var24 = p_Var24->_M_nxt) {
        pHVar12 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)*(uint *)&p_Var24[1]._M_nxt <
            (ulong)((long)(this->types).
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pHVar12 >> 3)) {
          HVar7 = HeapType::getKind(pHVar12 + *(uint *)&p_Var24[1]._M_nxt);
          if (HVar7 == Struct) {
            pmVar13 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->wasm->typeNames,
                                   (this->types).
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                                   *(uint *)&p_Var24[1]._M_nxt);
            p_Var22 = p_Var24[4]._M_nxt;
            if (p_Var22 != (_Hash_node_base *)0x0) {
              do {
                uVar1 = *(uint *)&p_Var22[1]._M_nxt;
                pSVar14 = HeapType::getStruct((HeapType *)
                                              ((long)&((((makeType.builder)->impl)._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                                  .
                                                  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>
                                                  ._M_head_impl)->tupleStore).mutex.
                                                  super___recursive_mutex_base._M_mutex +
                                              (ulong)*(uint *)&p_Var24[1]._M_nxt * 8));
                pcVar19 = (char *)((long)(pSVar14->fields).
                                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pSVar14->fields).
                                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4);
                if ((char *)(ulong)uVar1 < pcVar19) {
                  pmVar15 = std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&pmVar13->fieldNames,(key_type *)(p_Var22 + 1));
                  p_Var2 = p_Var22[3]._M_nxt;
                  (pmVar15->super_IString).str._M_len = (size_t)p_Var22[2]._M_nxt;
                  (pmVar15->super_IString).str._M_str = (char *)p_Var2;
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "warning: field index out of bounds in name section: ",0x34);
                  name_00.super_IString.str._M_str = pcVar19;
                  name_00.super_IString.str._M_len = (size_t)p_Var22[3]._M_nxt;
                  poVar16 = wasm::operator<<((wasm *)&std::cerr,(ostream *)p_Var22[2]._M_nxt,name_00
                                            );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16," at index ",10);
                  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16," in type ",9);
                  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                  auStack_238[0] = 10;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,auStack_238,1);
                }
                p_Var22 = p_Var22->_M_nxt;
              } while (p_Var22 != (_Hash_node_base *)0x0);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: field names applied to non-struct type at index ",0x39);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            auStack_238[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,auStack_238,1);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "warning: type index out of bounds in name section: fields at index ",0x43);
          poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          auStack_238[0] = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,auStack_238,1);
        }
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
        ::_S_vtable._M_arr
        [(byte)results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage]._M_data)
                ((anon_class_1_0_00000001 *)auStack_238,
                 (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  *)auStack_58);
      TypeBuilder::~TypeBuilder((TypeBuilder *)&stack0xffffffffffffffc8);
      return;
    }
    bVar3 = getInt8(this);
    if (bVar3 == 0x4e) {
      uVar4 = getU32LEB(this);
      if (uVar4 == 0) {
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_258,"Recursion groups of size zero not supported","");
        throwError(this,&local_258);
      }
      TypeBuilder::grow((TypeBuilder *)&stack0xffffffffffffffc8,(ulong)(uVar4 - 1));
      TypeBuilder::createRecGroup((TypeBuilder *)&stack0xffffffffffffffc8,uVar25,(ulong)uVar4);
      bVar3 = getInt8(this);
    }
    if ((byte)(bVar3 + 0xb1) < 2) {
      if (bVar3 == 0x50) {
        TypeBuilder::setOpen((TypeBuilder *)&stack0xffffffffffffffc8,uVar25,true);
      }
      uVar4 = getU32LEB(this);
      if (uVar4 != 0) {
        if (uVar4 != 1) {
          std::__cxx11::to_string((string *)auStack_58,uVar4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_238,"Invalid type definition with ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_58);
          plVar17 = (long *)std::__cxx11::string::append(auStack_238);
          local_b0._M_dataplus._M_p = (pointer)*plVar17;
          psVar20 = (size_type *)(plVar17 + 2);
          if ((size_type *)local_b0._M_dataplus._M_p == psVar20) {
            local_b0.field_2._M_allocated_capacity = *psVar20;
            local_b0.field_2._8_8_ = plVar17[3];
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar20;
          }
          local_b0._M_string_length = plVar17[1];
          *plVar17 = (long)psVar20;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          throwError(this,&local_b0);
        }
        uVar4 = getU32LEB(this);
        sVar8 = TypeBuilder::size((TypeBuilder *)&stack0xffffffffffffffc8);
        if (sVar8 <= uVar4) {
          std::__cxx11::to_string((string *)auStack_238,uVar4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &readHeapType.builder,"invalid supertype index: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_238);
          throwError(this,(string *)&readHeapType.builder);
        }
        _Var9._M_value =
             TypeBuilder::getTempHeapType((TypeBuilder *)&stack0xffffffffffffffc8,(ulong)uVar4);
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
             (HeapType)(HeapType)_Var9;
        TypeBuilder::setSubType((TypeBuilder *)&stack0xffffffffffffffc8,uVar25,super);
      }
      bVar3 = getInt8(this);
    }
    if (bVar3 == 0x65) {
      TypeBuilder::setShared((TypeBuilder *)&stack0xffffffffffffffc8,uVar25,Shared);
      bVar3 = getInt8(this);
    }
    if (bVar3 == 0x4c) {
      uVar4 = getU32LEB(this);
      sVar8 = TypeBuilder::size((TypeBuilder *)&stack0xffffffffffffffc8);
      if (sVar8 <= uVar4) {
        std::__cxx11::to_string((string *)auStack_238,uVar4);
        std::operator+(&local_2b8,"invalid described type index: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_238);
        throwError(this,&local_2b8);
      }
      _Var9._M_value =
           TypeBuilder::getTempHeapType((TypeBuilder *)&stack0xffffffffffffffc8,(ulong)uVar4);
      desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
      desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
           (HeapType)(HeapType)_Var9;
      TypeBuilder::setDescribed((TypeBuilder *)&stack0xffffffffffffffc8,uVar25,desc);
      bVar3 = getInt8(this);
    }
    if (bVar3 == 0x4d) {
      uVar4 = getU32LEB(this);
      sVar8 = TypeBuilder::size((TypeBuilder *)&stack0xffffffffffffffc8);
      if (sVar8 <= uVar4) {
        std::__cxx11::to_string((string *)auStack_238,uVar4);
        std::operator+(&local_298,"invalid descriptor type index: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_238);
        throwError(this,&local_298);
      }
      _Var9._M_value =
           TypeBuilder::getTempHeapType((TypeBuilder *)&stack0xffffffffffffffc8,(ulong)uVar4);
      desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
      desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
           (HeapType)(HeapType)_Var9;
      TypeBuilder::setDescriptor((TypeBuilder *)&stack0xffffffffffffffc8,uVar25,desc_00);
      bVar3 = getInt8(this);
    }
    switch(bVar3) {
    case 0x5d:
      pVar28 = readTypes::anon_class_16_2_dbef1248::operator()
                         ((anon_class_16_2_dbef1248 *)local_2e8);
      auStack_58 = (undefined1  [8])pVar28.first.id;
      results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,pVar28.second);
      if (pVar28.second != Inexact) {
        psVar18 = (string *)__cxa_allocate_exception(0x30);
        auStack_238 = (undefined1  [8])
                      &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_238,"invalid exact type in cont definition","");
        *(string **)psVar18 = psVar18 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  (psVar18,auStack_238,
                   (pointer)((long)&(params.
                                     super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->id +
                            (long)auStack_238));
        *(undefined4 *)(psVar18 + 0x20) = 0xffffffff;
        *(undefined4 *)(psVar18 + 0x24) = 0xffffffff;
        *(undefined4 *)(psVar18 + 0x28) = 0xffffffff;
        *(undefined4 *)(psVar18 + 0x2c) = 0xffffffff;
        __cxa_throw(psVar18,&ParseException::typeinfo,ParseException::~ParseException);
      }
      HVar7 = HeapType::getKind((HeapType *)auStack_58);
      if (HVar7 != Func) {
        psVar18 = (string *)__cxa_allocate_exception(0x30);
        auStack_238 = (undefined1  [8])
                      &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_238,"cont types must be built from function types","");
        *(string **)psVar18 = psVar18 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  (psVar18,auStack_238,
                   (pointer)((long)&(params.
                                     super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->id +
                            (long)auStack_238));
        *(undefined4 *)(psVar18 + 0x20) = 0xffffffff;
        *(undefined4 *)(psVar18 + 0x24) = 0xffffffff;
        *(undefined4 *)(psVar18 + 0x28) = 0xffffffff;
        *(undefined4 *)(psVar18 + 0x2c) = 0xffffffff;
        __cxa_throw(psVar18,&ParseException::typeinfo,ParseException::~ParseException);
      }
      TypeBuilder::setHeapType
                ((TypeBuilder *)&stack0xffffffffffffffc8,uVar25,(Continuation)auStack_58);
      break;
    case 0x5e:
      iVar6 = getS32LEB(this);
      if (iVar6 == -8) {
        TVar10.id = 2;
        uVar23 = 1;
      }
      else if (iVar6 == -9) {
        uVar23 = 2;
        TVar10.id = 2;
      }
      else {
        TVar10 = readTypes::anon_class_24_3_475464a4::operator()
                           ((anon_class_24_3_475464a4 *)local_90,iVar6);
        uVar23 = 0;
      }
      MVar5 = readTypes::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this);
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)MVar5 << 0x20 | uVar23);
      auStack_238 = (undefined1  [8])TVar10.id;
      TypeBuilder::setHeapType((TypeBuilder *)&stack0xffffffffffffffc8,uVar25,(Array *)auStack_238);
      break;
    case 0x5f:
      auStack_238 = (undefined1  [8])0x0;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar4 = getU32LEB(this);
      if (uVar4 == 0) {
        auStack_58._0_4_ = 0;
        auStack_58._4_4_ = 0;
        uVar26 = 0;
        uVar27 = 0;
        results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
      }
      else {
        uVar23 = (ulong)uVar4;
        do {
          iVar6 = getS32LEB(this);
          if (iVar6 == -8) {
            TVar10.id = 2;
            uVar21 = 1;
          }
          else if (iVar6 == -9) {
            uVar21 = 2;
            TVar10.id = 2;
          }
          else {
            TVar10 = readTypes::anon_class_24_3_475464a4::operator()
                               ((anon_class_24_3_475464a4 *)local_90,iVar6);
            uVar21 = 0;
          }
          MVar5 = readTypes::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this);
          local_68._8_8_ = (ulong)MVar5 << 0x20 | uVar21;
          local_68.type.id = TVar10.id;
          if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start ==
              params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::_M_realloc_insert<wasm::Field>
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_238,
                       (iterator)
                       params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_start,&local_68);
          }
          else {
            (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->id = (uintptr_t)TVar10;
            params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start[1].id = local_68._8_8_;
            params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start =
                 params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start + 2;
          }
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
        results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish =
             params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
        auStack_58._0_4_ = auStack_238._0_4_;
        auStack_58._4_4_ = auStack_238._4_4_;
        uVar26 = params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_;
        uVar27 = params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_;
      }
      results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar27,uVar26);
      TypeBuilder::setHeapType((TypeBuilder *)&stack0xffffffffffffffc8,uVar25,(Struct *)auStack_58);
      if (auStack_58 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_58,
                        (long)results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
      }
      break;
    case 0x60:
      auStack_238 = (undefined1  [8])0x0;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_58 = (undefined1  [8])0x0;
      results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      uVar4 = getU32LEB(this);
      if (uVar4 != 0) {
        uVar23 = (ulong)uVar4;
        do {
          iVar6 = getS32LEB(this);
          local_68.type =
               readTypes::anon_class_24_3_475464a4::operator()
                         ((anon_class_24_3_475464a4 *)local_90,iVar6);
          if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start ==
              params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_238,
                       (iterator)
                       params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_start,&local_68.type);
          }
          else {
            (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->id = (uintptr_t)local_68.type;
            params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start =
                 params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
      uVar4 = getU32LEB(this);
      if (uVar4 != 0) {
        uVar23 = (ulong)uVar4;
        do {
          iVar6 = getS32LEB(this);
          local_68.type =
               readTypes::anon_class_24_3_475464a4::operator()
                         ((anon_class_24_3_475464a4 *)local_90,iVar6);
          if (results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start ==
              results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,
                       (iterator)
                       results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_start,&local_68.type);
          }
          else {
            (results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->id = (uintptr_t)local_68.type;
            results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start =
                 results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
      TVar10 = TypeBuilder::getTempTupleType
                         ((TypeBuilder *)&stack0xffffffffffffffc8,(Tuple *)auStack_238);
      TVar11 = TypeBuilder::getTempTupleType
                         ((TypeBuilder *)&stack0xffffffffffffffc8,(Tuple *)auStack_58);
      if (auStack_58 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_58,
                        (long)results.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
      }
      if (auStack_238 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_238,
                        (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_238);
      }
      signature.results.id = TVar11.id;
      signature.params.id = TVar10.id;
      TypeBuilder::setHeapType((TypeBuilder *)&stack0xffffffffffffffc8,uVar25,signature);
      break;
    default:
      std::__cxx11::to_string((string *)auStack_238,(uint)bVar3);
      std::operator+(&local_278,"Bad type form ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_238);
      throwError(this,&local_278);
    }
    uVar25 = uVar25 + 1;
  } while( true );
}

Assistant:

void WasmBinaryReader::readTypes() {
  TypeBuilder builder(getU32LEB());

  auto readHeapType = [&]() -> std::pair<HeapType, Exactness> {
    int64_t htCode = getS64LEB(); // TODO: Actually s33
    auto exactness = Inexact;
    if (htCode == BinaryConsts::EncodedType::ExactLEB) {
      exactness = Exact;
      htCode = getS64LEB(); // TODO: Actually s33
    }
    if (htCode >= 0) {
      if (size_t(htCode) >= builder.size()) {
        throwError("invalid type index: " + std::to_string(htCode));
      }
      return {builder.getTempHeapType(size_t(htCode)), exactness};
    }
    if (exactness == Exact) {
      throwError("invalid type index: " + std::to_string(htCode));
    }
    auto share = Unshared;
    if (htCode == BinaryConsts::EncodedType::SharedLEB) {
      share = Shared;
      htCode = getS64LEB(); // TODO: Actually s33
    }
    HeapType ht;
    if (getBasicHeapType(htCode, ht)) {
      return {ht.getBasic(share), Inexact};
    }
    throwError("invalid wasm heap type: " + std::to_string(htCode));
  };
  auto makeType = [&](int32_t typeCode) {
    Type type;
    if (getBasicType(typeCode, type)) {
      return type;
    }

    switch (typeCode) {
      case BinaryConsts::EncodedType::nullable:
      case BinaryConsts::EncodedType::nonnullable: {
        auto nullability = typeCode == BinaryConsts::EncodedType::nullable
                             ? Nullable
                             : NonNullable;

        auto [ht, exactness] = readHeapType();
        if (ht.isBasic()) {
          return Type(ht, nullability, exactness);
        }

        return builder.getTempRefType(ht, nullability, exactness);
      }
      default:
        throwError("unexpected type index: " + std::to_string(typeCode));
    }
    WASM_UNREACHABLE("unexpected type");
  };
  auto readType = [&]() { return makeType(getS32LEB()); };

  auto readSignatureDef = [&]() {
    std::vector<Type> params;
    std::vector<Type> results;
    size_t numParams = getU32LEB();
    for (size_t j = 0; j < numParams; j++) {
      params.push_back(readType());
    }
    auto numResults = getU32LEB();
    for (size_t j = 0; j < numResults; j++) {
      results.push_back(readType());
    }
    return Signature(builder.getTempTupleType(params),
                     builder.getTempTupleType(results));
  };

  auto readContinuationDef = [&]() {
    auto [ht, exactness] = readHeapType();
    if (exactness != Inexact) {
      throw ParseException("invalid exact type in cont definition");
    }
    if (!ht.isSignature()) {
      throw ParseException("cont types must be built from function types");
    }
    return Continuation(ht);
  };

  auto readMutability = [&]() {
    switch (getU32LEB()) {
      case 0:
        return Immutable;
      case 1:
        return Mutable;
      default:
        throw ParseException("Expected 0 or 1 for mutability");
    }
  };

  auto readFieldDef = [&]() {
    // The value may be a general wasm type, or one of the types only possible
    // in a field.
    auto typeCode = getS32LEB();
    if (typeCode == BinaryConsts::EncodedType::i8) {
      auto mutable_ = readMutability();
      return Field(Field::i8, mutable_);
    }
    if (typeCode == BinaryConsts::EncodedType::i16) {
      auto mutable_ = readMutability();
      return Field(Field::i16, mutable_);
    }
    // It's a regular wasm value.
    auto type = makeType(typeCode);
    auto mutable_ = readMutability();
    return Field(type, mutable_);
  };

  auto readStructDef = [&]() {
    FieldList fields;
    size_t numFields = getU32LEB();
    for (size_t j = 0; j < numFields; j++) {
      fields.push_back(readFieldDef());
    }
    return Struct(std::move(fields));
  };

  for (size_t i = 0; i < builder.size(); i++) {
    auto form = getInt8();
    if (form == BinaryConsts::EncodedType::Rec) {
      uint32_t groupSize = getU32LEB();
      if (groupSize == 0u) {
        // TODO: Support groups of size zero by shrinking the builder.
        throwError("Recursion groups of size zero not supported");
      }
      // The group counts as one element in the type section, so we have to
      // allocate space for the extra types.
      builder.grow(groupSize - 1);
      builder.createRecGroup(i, groupSize);
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Sub ||
        form == BinaryConsts::EncodedType::SubFinal) {
      if (form == BinaryConsts::EncodedType::Sub) {
        builder[i].setOpen();
      }
      uint32_t supers = getU32LEB();
      if (supers > 0) {
        if (supers != 1) {
          throwError("Invalid type definition with " + std::to_string(supers) +
                     " supertypes");
        }
        auto superIdx = getU32LEB();
        if (superIdx >= builder.size()) {
          throwError("invalid supertype index: " + std::to_string(superIdx));
        }
        builder[i].subTypeOf(builder[superIdx]);
      }
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Shared) {
      builder[i].setShared();
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Describes) {
      auto descIdx = getU32LEB();
      if (descIdx >= builder.size()) {
        throwError("invalid described type index: " + std::to_string(descIdx));
      }
      builder[i].describes(builder[descIdx]);
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Descriptor) {
      auto descIdx = getU32LEB();
      if (descIdx >= builder.size()) {
        throwError("invalid descriptor type index: " + std::to_string(descIdx));
      }
      builder[i].descriptor(builder[descIdx]);
      form = getInt8();
    }
    if (form == BinaryConsts::EncodedType::Func) {
      builder[i] = readSignatureDef();
    } else if (form == BinaryConsts::EncodedType::Cont) {
      builder[i] = readContinuationDef();
    } else if (form == BinaryConsts::EncodedType::Struct) {
      builder[i] = readStructDef();
    } else if (form == BinaryConsts::EncodedType::Array) {
      builder[i] = Array(readFieldDef());
    } else {
      throwError("Bad type form " + std::to_string(form));
    }
  }

  auto result = builder.build();
  if (auto* err = result.getError()) {
    Fatal() << "Invalid type: " << err->reason << " at index " << err->index;
  }
  types = std::move(*result);

  // Record the type indices.
  for (Index i = 0; i < types.size(); ++i) {
    wasm.typeIndices.insert({types[i], i});
  }

  // Assign names from the names section.
  for (auto& [index, name] : typeNames) {
    if (index >= types.size()) {
      std::cerr << "warning: type index out of bounds in name section: " << name
                << " at index " << index << '\n';
      continue;
    }
    wasm.typeNames[types[index]].name = name;
  }
  for (auto& [index, fields] : fieldNames) {
    if (index >= types.size()) {
      std::cerr
        << "warning: type index out of bounds in name section: fields at index "
        << index << '\n';
      continue;
    }
    if (!types[index].isStruct()) {
      std::cerr << "warning: field names applied to non-struct type at index "
                << index << '\n';
      continue;
    }
    auto& names = wasm.typeNames[types[index]].fieldNames;
    for (auto& [field, name] : fields) {
      if (field >= types[index].getStruct().fields.size()) {
        std::cerr << "warning: field index out of bounds in name section: "
                  << name << " at index " << field << " in type " << index
                  << '\n';
        continue;
      }
      names[field] = name;
    }
  }
}